

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O0

Vec_Int_t *
Ssw_TransferSignalPairs
          (Aig_Man_t *pMiter,Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vIds1,Vec_Int_t *vIds2)

{
  int iVar1;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int local_5c;
  int i;
  Aig_Obj_t *pObj2m;
  Aig_Obj_t *pObj1m;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  Vec_Int_t *vIds;
  Vec_Int_t *vIds2_local;
  Vec_Int_t *vIds1_local;
  Aig_Man_t *pAig2_local;
  Aig_Man_t *pAig1_local;
  Aig_Man_t *pMiter_local;
  
  iVar1 = Vec_IntSize(vIds1);
  p = Vec_IntAlloc(iVar1 << 1);
  local_5c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vIds1);
    if (iVar1 <= local_5c) {
      return p;
    }
    iVar1 = Vec_IntEntry(vIds1,local_5c);
    pAVar2 = Aig_ManObj(pAig1,iVar1);
    iVar1 = Vec_IntEntry(vIds2,local_5c);
    pAVar3 = Aig_ManObj(pAig2,iVar1);
    pAVar2 = Aig_Regular((Aig_Obj_t *)(pAVar2->field_5).pData);
    pAVar3 = Aig_Regular((Aig_Obj_t *)(pAVar3->field_5).pData);
    if ((pAVar2 == (Aig_Obj_t *)0x0) || (pAVar3 == (Aig_Obj_t *)0x0)) break;
    if (pAVar2 != pAVar3) {
      if (pAVar2->Id < pAVar3->Id) {
        Vec_IntPush(p,pAVar2->Id);
        Vec_IntPush(p,pAVar3->Id);
      }
      else {
        Vec_IntPush(p,pAVar3->Id);
        Vec_IntPush(p,pAVar2->Id);
      }
    }
    local_5c = local_5c + 1;
  }
  __assert_fail("pObj1m && pObj2m",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                ,0x79,
                "Vec_Int_t *Ssw_TransferSignalPairs(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

Vec_Int_t * Ssw_TransferSignalPairs( Aig_Man_t * pMiter, Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vIds1, Vec_Int_t * vIds2 )
{
    Vec_Int_t * vIds;
    Aig_Obj_t * pObj1, * pObj2;
    Aig_Obj_t * pObj1m, * pObj2m;
    int i;
    vIds = Vec_IntAlloc( 2 * Vec_IntSize(vIds1) );
    for ( i = 0; i < Vec_IntSize(vIds1); i++ )
    {
        pObj1 = Aig_ManObj( pAig1, Vec_IntEntry(vIds1, i) );
        pObj2 = Aig_ManObj( pAig2, Vec_IntEntry(vIds2, i) );
        pObj1m = Aig_Regular((Aig_Obj_t *)pObj1->pData);
        pObj2m = Aig_Regular((Aig_Obj_t *)pObj2->pData);
        assert( pObj1m && pObj2m );
        if ( pObj1m == pObj2m )
            continue;
        if ( pObj1m->Id < pObj2m->Id )
        {
            Vec_IntPush( vIds, pObj1m->Id );
            Vec_IntPush( vIds, pObj2m->Id );
        }
        else
        {
            Vec_IntPush( vIds, pObj2m->Id );
            Vec_IntPush( vIds, pObj1m->Id );
        }
    }
    return vIds;
}